

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

void __thiscall kj::ExceptionCallback::ExceptionCallback(ExceptionCallback *this)

{
  ExceptionCallback *pEVar1;
  long in_FS_OFFSET;
  char stackVar;
  Fault f;
  undefined1 local_11;
  Fault local_10;
  
  this->_vptr_ExceptionCallback = (_func_int **)&PTR__ExceptionCallback_001ba4e0;
  pEVar1 = getExceptionCallback();
  this->next = pEVar1;
  if ((ulong)((long)this + (0xffff - (long)&local_11)) < 0x1ffff) {
    *(ExceptionCallback **)(in_FS_OFFSET + -8) = this;
    return;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
             ,0x2f0,FAILED,"offset < 65536 && offset > -65536",
             "\"ExceptionCallback must be allocated on the stack.\"",
             (char (*) [50])"ExceptionCallback must be allocated on the stack.");
  _::Debug::Fault::fatal(&local_10);
}

Assistant:

ExceptionCallback::ExceptionCallback(): next(getExceptionCallback()) {
  char stackVar;
  ptrdiff_t offset = reinterpret_cast<char*>(this) - &stackVar;
  KJ_ASSERT(offset < 65536 && offset > -65536,
            "ExceptionCallback must be allocated on the stack.");

  threadLocalCallback = this;
}